

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O2

int run_test_fs_poll(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  
  ::loop = (uv_loop_t *)uv_default_loop();
  remove("testfile");
  iVar1 = uv_timer_init(::loop,&timer_handle);
  if (iVar1 == 0) {
    iVar1 = uv_fs_poll_init(::loop,&poll_handle);
    if (iVar1 == 0) {
      iVar1 = uv_fs_poll_start(&poll_handle,poll_cb,"testfile",100);
      if (iVar1 == 0) {
        iVar1 = uv_run(::loop,0);
        if (iVar1 == 0) {
          if (poll_cb_called == 5) {
            if (timer_cb_called == 2) {
              if (close_cb_called == 1) {
                loop = (uv_loop_t *)uv_default_loop();
                close_loop(loop);
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                if (iVar1 == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                uVar2 = 0xa7;
              }
              else {
                pcVar3 = "close_cb_called == 1";
                uVar2 = 0xa5;
              }
            }
            else {
              pcVar3 = "timer_cb_called == 2";
              uVar2 = 0xa4;
            }
          }
          else {
            pcVar3 = "poll_cb_called == 5";
            uVar2 = 0xa3;
          }
        }
        else {
          pcVar3 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
          uVar2 = 0xa1;
        }
      }
      else {
        pcVar3 = "0 == uv_fs_poll_start(&poll_handle, poll_cb, FIXTURE, 100)";
        uVar2 = 0xa0;
      }
    }
    else {
      pcVar3 = "0 == uv_fs_poll_init(loop, &poll_handle)";
      uVar2 = 0x9f;
    }
  }
  else {
    pcVar3 = "0 == uv_timer_init(loop, &timer_handle)";
    uVar2 = 0x9e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_poll) {
  loop = uv_default_loop();

  remove(FIXTURE);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_fs_poll_init(loop, &poll_handle));
  ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb, FIXTURE, 100));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(poll_cb_called == 5);
  ASSERT(timer_cb_called == 2);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}